

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall chrono::ChForce::ArchiveOUT(ChForce *this,ChArchiveOut *marchive)

{
  AlignmentFrame_mapper alignmapper;
  ReferenceFrame_mapper refmapper;
  ForceType_mapper ftypemapper;
  ChEnumMapper<chrono::ChForce::ReferenceFrame> local_220;
  ChEnumMapper<chrono::ChForce::ReferenceFrame> local_200;
  ChEnumMapper<chrono::ChForce::AlignmentFrame> local_1e0;
  ChEnumMapper<chrono::ChForce::ForceType> local_1c0;
  ChNameValue<chrono::ChVector<double>_> local_1a0;
  ChNameValue<chrono::ChVector<double>_> local_188;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_170;
  ChNameValue<double> local_158;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_140;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_128;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_110;
  ChNameValue<chrono::ChVector<double>_> local_f8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_e0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_c8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_b0;
  ChNameValue<chrono::ChVector<double>_> local_98;
  ChNameValue<chrono::ChVector<double>_> local_80;
  ChNameValue<chrono::ChEnumMapper<chrono::ChForce::AlignmentFrame>_> local_68;
  ChNameValue<chrono::ChEnumMapper<chrono::ChForce::ReferenceFrame>_> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChForce::ForceType>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChForce>(marchive);
  ChObj::ArchiveOUT(&this->super_ChObj,marchive);
  ForceType_mapper::ForceType_mapper((ForceType_mapper *)&local_1c0);
  ForceType_mapper::operator()
            ((ChEnumMapper<chrono::ChForce::ForceType> *)&local_200,(ForceType_mapper *)&local_1c0,
             &this->mode);
  local_38._name = "force_type";
  local_38._flags = '\0';
  local_38._value = (ChEnumMapper<chrono::ChForce::ForceType> *)&local_200;
  ChArchiveOut::operator<<(marchive,&local_38);
  ChEnumMapper<chrono::ChForce::ForceType>::~ChEnumMapper
            ((ChEnumMapper<chrono::ChForce::ForceType> *)&local_200);
  ReferenceFrame_mapper::ReferenceFrame_mapper((ReferenceFrame_mapper *)&local_200);
  ReferenceFrame_mapper::operator()(&local_220,(ReferenceFrame_mapper *)&local_200,&this->frame);
  local_50._name = "reference_frame_type";
  local_50._flags = '\0';
  local_50._value = &local_220;
  ChArchiveOut::operator<<(marchive,&local_50);
  ChEnumMapper<chrono::ChForce::ReferenceFrame>::~ChEnumMapper(&local_220);
  AlignmentFrame_mapper::AlignmentFrame_mapper((AlignmentFrame_mapper *)&local_220);
  AlignmentFrame_mapper::operator()(&local_1e0,(AlignmentFrame_mapper *)&local_220,&this->align);
  local_68._name = "alignment_frame_type";
  local_68._flags = '\0';
  local_68._value = &local_1e0;
  ChArchiveOut::operator<<(marchive,&local_68);
  ChEnumMapper<chrono::ChForce::AlignmentFrame>::~ChEnumMapper(&local_1e0);
  local_80._value = &this->vrelpoint;
  local_80._name = "vrelpoint";
  local_80._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_80);
  local_98._value = &this->vpoint;
  local_98._name = "vpoint";
  local_98._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_98);
  local_b0._value = &this->move_x;
  local_b0._name = "move_x";
  local_b0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_b0);
  local_c8._value = &this->move_y;
  local_c8._name = "move_y";
  local_c8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c8);
  local_e0._value = &this->move_z;
  local_e0._name = "move_z";
  local_e0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_e0);
  local_f8._value = &this->restpos;
  local_f8._name = "restpos";
  local_f8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f8);
  local_110._value = &this->f_x;
  local_110._name = "f_x";
  local_110._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_110);
  local_128._value = &this->f_y;
  local_128._name = "f_y";
  local_128._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_128);
  local_140._value = &this->f_z;
  local_140._name = "f_z";
  local_140._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_140);
  local_158._value = &this->mforce;
  local_158._name = "mforce";
  local_158._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_158);
  local_170._value = &this->modula;
  local_170._name = "f_time";
  local_170._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_170);
  local_188._value = &this->vreldir;
  local_188._name = "vreldir";
  local_188._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_188);
  local_1a0._value = &this->vdir;
  local_1a0._name = "vdir";
  local_1a0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_1a0);
  ChEnumMapper<chrono::ChForce::AlignmentFrame>::~ChEnumMapper
            ((ChEnumMapper<chrono::ChForce::AlignmentFrame> *)&local_220);
  ChEnumMapper<chrono::ChForce::ReferenceFrame>::~ChEnumMapper(&local_200);
  ChEnumMapper<chrono::ChForce::ForceType>::~ChEnumMapper(&local_1c0);
  return;
}

Assistant:

void ChForce::ArchiveOUT(ChArchiveOut& marchive) {
    // class version number
    marchive.VersionWrite<ChForce>();

    // serialize parent class too
    ChObj::ArchiveOUT(marchive);

    // stream out all member data

    ForceType_mapper ftypemapper;
    marchive << CHNVP(ftypemapper(mode), "force_type");
    ReferenceFrame_mapper refmapper;
    marchive << CHNVP(refmapper(frame), "reference_frame_type");
    AlignmentFrame_mapper alignmapper;
    marchive << CHNVP(alignmapper(align), "alignment_frame_type");

    marchive << CHNVP(vrelpoint);
    marchive << CHNVP(vpoint);
    marchive << CHNVP(move_x);
    marchive << CHNVP(move_y);
    marchive << CHNVP(move_z);
    marchive << CHNVP(restpos);
    marchive << CHNVP(f_x);
    marchive << CHNVP(f_y);
    marchive << CHNVP(f_z);
    marchive << CHNVP(mforce);
    marchive << CHNVP(modula, "f_time");
    marchive << CHNVP(vreldir);
    marchive << CHNVP(vdir);
}